

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,Var newLength)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  double dVar5;
  
  if (((ulong)newLength & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)newLength & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)newLength & 0xffff000000000000) != 0x1000000000000) {
      scriptContext =
           (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
             javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      uVar3 = JavascriptConversion::ToUInt32_Full(newLength,scriptContext);
      if ((ulong)newLength >> 0x32 == 0) {
        dVar5 = JavascriptConversion::ToNumber_Full(newLength,scriptContext);
      }
      else {
        dVar5 = (double)((ulong)newLength ^ 0xfffc000000000000);
      }
      this_00 = scriptContext->threadContext;
      if ((dVar5 != (double)uVar3) || (NAN(dVar5) || NAN((double)uVar3))) {
        if ((this_00->implicitCallFlags != ImplicitCall_None) &&
           ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)) {
          return 1;
        }
        bVar2 = ThreadContext::RecordImplicitException(this_00);
        if (!bVar2) {
          return 1;
        }
        goto LAB_00b712a1;
      }
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      newLength = (Var)(ulong)uVar3;
      goto LAB_00b71269;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b712ad;
    *puVar4 = 0;
  }
  if (((ulong)newLength & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b712ad:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((int)newLength < 0) {
    scriptContext =
         (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (!bVar2) {
      return 1;
    }
LAB_00b712a1:
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
  }
LAB_00b71269:
  SetLength(this,(uint32)newLength);
  return 1;
}

Assistant:

BOOL JavascriptArray::SetLength(Var newLength)
    {
        ScriptContext *scriptContext;
        if(TaggedInt::Is(newLength))
        {
            int32 lenValue = TaggedInt::ToInt32(newLength);
            if (lenValue < 0)
            {
                scriptContext = GetScriptContext();
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            else
            {
                this->SetLength(lenValue);
            }
            return TRUE;
        }

        scriptContext = GetScriptContext();
        uint32 uintValue = JavascriptConversion::ToUInt32(newLength, scriptContext);
        double dblValue = JavascriptConversion::ToNumber(newLength, scriptContext);
        if (dblValue == uintValue)
        {
            // Conversion can change the type (e.g. from String), invalidating assumptions made by the JIT
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);

            this->SetLength(uintValue);
        }
        else
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            ImplicitCallFlags flags = threadContext->GetImplicitCallFlags();
            if (flags != ImplicitCall_None && threadContext->IsDisableImplicitCall())
            {
                // We couldn't execute the implicit call(s) needed to convert the newLength to an integer.
                // Do nothing and let the jitted code bail out.
                return TRUE;
            }

            if (threadContext->RecordImplicitException())
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }
        }

        return TRUE;
    }